

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::BlitTest::ClearFramebuffer
          (BlitTest *this,GLfloat red,GLfloat green,GLfloat blue,GLfloat depth,GLint stencil)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1c0))(red,green,blue,0x3f800000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearColor has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbec);
  (**(code **)(lVar3 + 0x1c8))((double)depth);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearColor has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbef);
  (**(code **)(lVar3 + 0x208))(stencil);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearColor has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbf2);
  (**(code **)(lVar3 + 0x188))(0x4500);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClearColor has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbf6);
  return;
}

Assistant:

void BlitTest::ClearFramebuffer(glw::GLfloat red, glw::GLfloat green, glw::GLfloat blue, glw::GLfloat depth,
								glw::GLint stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup clear values. */
	gl.clearColor(red, green, blue, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");

	gl.clearDepth(depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");

	gl.clearStencil(stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");

	/* Clearing. */
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");
}